

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_palette.cpp
# Opt level: O3

ComparisonResult __thiscall ProtoPalette::compare(ProtoPalette *this,ProtoPalette *other)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  ComparisonResult CVar5;
  long lVar6;
  long lVar7;
  ComparisonResult CVar8;
  byte bVar9;
  
  lVar6 = 2;
  do {
    if (lVar6 == 8) {
      lVar6 = 2;
      do {
        if (lVar6 == 8) {
          bVar4 = 1;
          lVar6 = 0;
          bVar9 = 1;
          lVar7 = 0;
          do {
            uVar2 = *(ushort *)((long)(other->_colorIndices)._M_elems + lVar6);
            uVar3 = *(ushort *)((long)(this->_colorIndices)._M_elems + lVar7);
            if (uVar3 == uVar2) {
              lVar7 = lVar7 + 2;
              lVar6 = lVar6 + 2;
            }
            else if (uVar3 < uVar2) {
              lVar7 = lVar7 + 2;
              bVar4 = 0;
            }
            else {
              lVar6 = lVar6 + 2;
              bVar9 = 0;
            }
          } while ((lVar7 != 8) && (lVar6 != 8));
          CVar8 = (ComparisonResult)(lVar6 == 8 & bVar9);
          CVar5 = -(uint)bVar4 | CVar8;
          if (lVar7 != 8) {
            CVar5 = CVar8;
          }
          return CVar5;
        }
        puVar1 = (ushort *)((long)(other->_colorIndices)._M_elems + lVar6);
        lVar7 = lVar6 + -2;
        lVar6 = lVar6 + 2;
      } while (*(ushort *)((long)(other->_colorIndices)._M_elems + lVar7) <= *puVar1);
      __assert_fail("std::is_sorted(other._colorIndices.begin(), other._colorIndices.end())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/proto_palette.cpp"
                    ,0x2e,
                    "ProtoPalette::ComparisonResult ProtoPalette::compare(const ProtoPalette &) const"
                   );
    }
    puVar1 = (ushort *)((long)(this->_colorIndices)._M_elems + lVar6);
    lVar7 = lVar6 + -2;
    lVar6 = lVar6 + 2;
  } while (*(ushort *)((long)(this->_colorIndices)._M_elems + lVar7) <= *puVar1);
  __assert_fail("std::is_sorted(_colorIndices.begin(), _colorIndices.end())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/proto_palette.cpp"
                ,0x2d,
                "ProtoPalette::ComparisonResult ProtoPalette::compare(const ProtoPalette &) const");
}

Assistant:

ProtoPalette::ComparisonResult ProtoPalette::compare(ProtoPalette const &other) const {
	// This works because the sets are sorted numerically
	assert(std::is_sorted(_colorIndices.begin(), _colorIndices.end()));
	assert(std::is_sorted(other._colorIndices.begin(), other._colorIndices.end()));

	auto ours = _colorIndices.begin(), theirs = other._colorIndices.begin();
	bool weBigger = true, theyBigger = true;

	while (ours != _colorIndices.end() && theirs != other._colorIndices.end()) {
		if (*ours == *theirs) {
			++ours;
			++theirs;
		} else if (*ours < *theirs) {
			++ours;
			theyBigger = false;
		} else { // *ours > *theirs
			++theirs;
			weBigger = false;
		}
	}
	weBigger &= theirs == other._colorIndices.end();
	theyBigger &= ours == _colorIndices.end();

	return theyBigger ? THEY_BIGGER : (weBigger ? WE_BIGGER : NEITHER);
}